

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.cpp
# Opt level: O3

void __thiscall
SourceMapTest_SourceMappingSingleSegment_Test::TestBody
          (SourceMapTest_SourceMappingSingleSegment_Test *this)

{
  string *sourceMap_00;
  char *in_R9;
  undefined1 local_98 [8];
  optional<wasm::Function::DebugLocation> loc;
  string sourceMap;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  internal local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  AssertHelper local_28;
  
  sourceMap_00 = (string *)
                 ((long)&loc.super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
                         _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>.
                         _M_payload._M_value.symbolNameIndex.
                         super__Optional_base<unsigned_int,_true,_true> + 4);
  loc.super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Function::DebugLocation>._16_8_ = &sourceMap._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)sourceMap_00,
             "\n      {\n          \"version\": 3,\n          \"sources\": [],\n          \"sourcesContent\": [],\n          \"names\": [],\n          \"mappings\": \"A\"\n      }\n  "
             ,"");
  SourceMapTest::parseMap(&this->super_SourceMapTest,sourceMap_00);
  ::wasm::SourceMapReader::readDebugLocationAt((ulong)local_98);
  local_40[0] = (internal)
                (loc.super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._12_1_ ^ 1);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (loc.super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._12_1_ != '\0') {
    testing::Message::Message((Message *)&local_30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&sourceMap.field_2 + 8),local_40,
               (AssertionResult *)"loc.has_value()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/source-map.cpp"
               ,0x54,(char *)sourceMap.field_2._8_8_);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sourceMap.field_2._8_8_ != &local_50) {
      operator_delete((void *)sourceMap.field_2._8_8_,local_50._M_allocated_capacity + 1);
    }
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
    if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_38,local_38);
    }
  }
  if ((size_type *)
      loc.super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Function::DebugLocation>._16_8_ !=
      &sourceMap._M_string_length) {
    operator_delete((void *)loc.super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
                            _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>.
                            _16_8_,sourceMap._M_string_length + 1);
  }
  return;
}

Assistant:

TEST_F(SourceMapTest, SourceMappingSingleSegment) {
  // A single-segment mapping starting at offset 0.
  std::string sourceMap = R"(
      {
          "version": 3,
          "sources": [],
          "sourcesContent": [],
          "names": [],
          "mappings": "A"
      }
  )";
  parseMap(sourceMap);

  auto loc = reader->readDebugLocationAt(0);
  EXPECT_FALSE(loc.has_value());
}